

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.hh
# Opt level: O3

bool __thiscall gss::innards::SVOBitset::any(SVOBitset *this)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = (ulong)this->n_words;
  if (uVar1 < 0x11) {
    if (uVar1 == 0) {
      return false;
    }
    lVar2 = 0;
    do {
      bVar3 = (this->_data).short_data[lVar2] != 0;
      if (bVar3) {
        return bVar3;
      }
      bVar4 = uVar1 - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
  }
  else {
    lVar2 = 0;
    do {
      bVar3 = (this->_data).long_data[lVar2] != 0;
      if (bVar3) {
        return bVar3;
      }
      bVar4 = uVar1 - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
  }
  return bVar3;
}

Assistant:

constexpr auto _is_long() const -> bool
        {
            return n_words > svo_size;
        }